

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall gmlc::networking::TcpConnection::waitOnClose(TcpConnection *this)

{
  bool bVar1;
  ostream *poVar2;
  int in_ESI;
  string sStack_1d8;
  stringstream str;
  ostream local_1a8 [376];
  
  if (((this->triggerhalt)._M_base._M_i & 1U) == 0) {
    close(this,in_ESI);
  }
  else {
    if (this->connecting == true) {
      concurrency::TriggerVariable::waitActivation(&this->connected);
    }
    while( true ) {
      _str = 200;
      bVar1 = concurrency::TriggerVariable::wait_for(&this->receivingHalt,(milliseconds *)&str);
      if (bVar1) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&str);
      poVar2 = std::operator<<(local_1a8,"wait timeout ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->state)._M_i);
      poVar2 = std::operator<<(poVar2," ");
      (*((this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_Socket[8])();
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::__cxx11::stringbuf::str();
      logger(this,1,&sStack_1d8);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::ios::clear((int)*(undefined8 *)(_str + -0x18) + (int)(stringstream *)&str);
      poVar2 = std::operator<<(local_1a8,"wait info ");
      ::asio::io_context::stopped((io_context *)this->context_);
      poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::_M_insert<bool>(SUB81(poVar2,0));
      std::__cxx11::stringbuf::str();
      logger(this,1,&sStack_1d8);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    }
  }
  LOCK();
  (this->state)._M_i = CLOSED;
  UNLOCK();
  return;
}

Assistant:

void TcpConnection::waitOnClose()
{
    if (triggerhalt.load(std::memory_order_acquire)) {
        if (connecting) {
            connected.waitActivation();
        }

        while (!receivingHalt.wait_for(std::chrono::milliseconds(200))) {
            std::stringstream str;
            str << "wait timeout " << static_cast<int>(state.load()) << " "
                << socket_->is_open() << " " << receivingHalt.isTriggered();
            logger(1, str.str());
            str.clear();

            str << "wait info " << context_.stopped() << " " << connecting;
            logger(1, str.str());
        }
    } else {
        close();
    }
    state.store(ConnectionStates::CLOSED);
}